

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeCallbackDispatcher.hpp
# Opt level: O2

void __thiscall
ableton::platforms::
LockFreeCallbackDispatcher<std::function<void_()>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
::run(LockFreeCallbackDispatcher<std::function<void_()>,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
      *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_38;
  
  while (((this->mRunning)._M_base._M_i & 1U) != 0) {
    std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->mMutex);
    std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
              (&this->mCondition,&uStack_38,&this->mFallbackPeriod);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
    std::function<void_()>::operator()(&this->mCallback);
  }
  return;
}

Assistant:

void run()
  {
    while (mRunning.load())
    {
      {
        std::unique_lock<std::mutex> lock(mMutex);
        mCondition.wait_for(lock, mFallbackPeriod);
      }
      mCallback();
    }
  }